

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

LatencyItem * __thiscall
LatencyCollector::getAggrItem
          (LatencyItem *__return_storage_ptr__,LatencyCollector *this,string *lat_name)

{
  LatencyItem *this_00;
  long lVar1;
  bool bVar2;
  long *plVar3;
  MapWrapperSP cur_map_p;
  string actual_name;
  ashared_ptr<MapWrapper> local_a0;
  string local_70 [8];
  long local_68;
  string local_50;
  
  LatencyItem::LatencyItem(__return_storage_ptr__);
  if (lat_name->_M_string_length != 0) {
    ashared_ptr<MapWrapper>::ashared_ptr(&local_a0,&this->latestMap);
    plVar3 = (long *)(*(long *)local_a0.object._M_b._M_p + 0x10);
    while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
      this_00 = (LatencyItem *)plVar3[5];
      LatencyItem::getActualFunction_abi_cxx11_(&local_50,this_00);
      bVar2 = std::operator!=(&local_50,lat_name);
      if (!bVar2) {
        std::__cxx11::string::string(local_70,(string *)__return_storage_ptr__);
        lVar1 = local_68;
        std::__cxx11::string::~string(local_70);
        if (lVar1 == 0) {
          LatencyItem::operator=(__return_storage_ptr__,this_00);
        }
        else {
          Histogram::operator+=(&__return_storage_ptr__->hist,&this_00->hist);
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    ashared_ptr<MapWrapper>::~ashared_ptr(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

LatencyItem getAggrItem(const std::string& lat_name) {
        LatencyItem ret;
        if (lat_name.empty()) return ret;

        MapWrapperSP cur_map_p = latestMap;
        MapWrapper* cur_map = cur_map_p.get();

        for (auto& entry: cur_map->map) {
            LatencyItem *item = entry.second;
            std::string actual_name = item->getActualFunction();

            if (actual_name != lat_name) continue;

            if (ret.getName().empty()) {
                // Initialize.
                ret = *item;
            } else {
                // Already exists.
                ret += *item;
            }
        }

        return ret;
    }